

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_finish(mbedtls_cipher_context_t *ctx,uchar *output,size_t *olen)

{
  mbedtls_operation_t mVar1;
  int iVar2;
  ulong uVar3;
  mbedtls_cipher_info_t *pmVar4;
  size_t sVar5;
  uint uVar6;
  
  if (ctx == (mbedtls_cipher_context_t *)0x0) {
    return -0x6100;
  }
  pmVar4 = ctx->cipher_info;
  if (olen == (size_t *)0x0 || pmVar4 == (mbedtls_cipher_info_t *)0x0) {
    return -0x6100;
  }
  *olen = 0;
  iVar2 = 0;
  switch(pmVar4->mode) {
  case MBEDTLS_MODE_ECB:
switchD_0012e8d3_caseD_1:
    uVar3 = ctx->unprocessed_len;
    break;
  case MBEDTLS_MODE_CBC:
    mVar1 = ctx->operation;
    if (mVar1 == MBEDTLS_ENCRYPT) {
      if (ctx->add_padding != (_func_void_uchar_ptr_size_t_size_t *)0x0) {
        uVar3 = ctx->iv_size;
        if (uVar3 == 0) {
          uVar3 = (ulong)pmVar4->iv_size;
        }
        (*ctx->add_padding)(ctx->unprocessed_data,(long)(int)uVar3,ctx->unprocessed_len);
        pmVar4 = ctx->cipher_info;
        mVar1 = ctx->operation;
        sVar5 = (size_t)pmVar4->block_size;
        goto LAB_0012e933;
      }
      goto switchD_0012e8d3_caseD_1;
    }
    sVar5 = (size_t)pmVar4->block_size;
    if (ctx->unprocessed_len == sVar5) {
LAB_0012e933:
      iVar2 = (*pmVar4->base->cbc_func)
                        (ctx->cipher_ctx,mVar1,sVar5,ctx->iv,ctx->unprocessed_data,output);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (ctx->operation != MBEDTLS_DECRYPT) {
        if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)ctx->cipher_info->block_size;
        }
        *olen = uVar3;
        return 0;
      }
      if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = ctx->cipher_info->block_size;
      }
      iVar2 = (*ctx->get_padding)(output,(size_t)uVar6,olen);
      return iVar2;
    }
    uVar3 = ctx->unprocessed_len | (ulong)ctx->add_padding;
    break;
  case MBEDTLS_MODE_CFB:
  case MBEDTLS_MODE_CTR:
  case MBEDTLS_MODE_GCM:
  case MBEDTLS_MODE_STREAM:
    goto switchD_0012e8d3_caseD_3;
  default:
    iVar2 = -0x6080;
    goto switchD_0012e8d3_caseD_3;
  }
  iVar2 = -0x6280;
  if (uVar3 == 0) {
    iVar2 = 0;
  }
switchD_0012e8d3_caseD_3:
  return iVar2;
}

Assistant:

int mbedtls_cipher_finish( mbedtls_cipher_context_t *ctx,
                   unsigned char *output, size_t *olen )
{
    if( NULL == ctx || NULL == ctx->cipher_info || NULL == olen )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    *olen = 0;

    if( MBEDTLS_MODE_CFB == ctx->cipher_info->mode ||
        MBEDTLS_MODE_CTR == ctx->cipher_info->mode ||
        MBEDTLS_MODE_GCM == ctx->cipher_info->mode ||
        MBEDTLS_MODE_STREAM == ctx->cipher_info->mode )
    {
        return( 0 );
    }

    if( MBEDTLS_MODE_ECB == ctx->cipher_info->mode )
    {
        if( ctx->unprocessed_len != 0 )
            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

        return( 0 );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( MBEDTLS_MODE_CBC == ctx->cipher_info->mode )
    {
        int ret = 0;

        if( MBEDTLS_ENCRYPT == ctx->operation )
        {
            /* check for 'no padding' mode */
            if( NULL == ctx->add_padding )
            {
                if( 0 != ctx->unprocessed_len )
                    return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

                return( 0 );
            }

            ctx->add_padding( ctx->unprocessed_data, mbedtls_cipher_get_iv_size( ctx ),
                    ctx->unprocessed_len );
        }
        else if( mbedtls_cipher_get_block_size( ctx ) != ctx->unprocessed_len )
        {
            /*
             * For decrypt operations, expect a full block,
             * or an empty block if no padding
             */
            if( NULL == ctx->add_padding && 0 == ctx->unprocessed_len )
                return( 0 );

            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );
        }

        /* cipher block */
        if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                ctx->operation, mbedtls_cipher_get_block_size( ctx ), ctx->iv,
                ctx->unprocessed_data, output ) ) )
        {
            return( ret );
        }

        /* Set output size for decryption */
        if( MBEDTLS_DECRYPT == ctx->operation )
            return ctx->get_padding( output, mbedtls_cipher_get_block_size( ctx ),
                                     olen );

        /* Set output size for encryption */
        *olen = mbedtls_cipher_get_block_size( ctx );
        return( 0 );
    }
#else
    ((void) output);
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
}